

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O2

RC __thiscall QL_NodeRel::CloseIt(QL_NodeRel *this)

{
  RC RVar1;
  int iVar2;
  int extraout_EAX;
  
  if (this->useIndex == true) {
    RVar1 = RM_Manager::CloseFile(((this->super_QL_Node).qlm)->rmm,&this->fh);
    if (RVar1 != 0) {
      return RVar1;
    }
    iVar2 = yyparse();
    if (iVar2 != 0) {
      return iVar2;
    }
    IX_Manager::DestroyIndex(((this->super_QL_Node).qlm)->ixm);
    iVar2 = extraout_EAX;
  }
  else {
    RVar1 = RM_FileScan::CloseScan(&this->fs);
    if (RVar1 != 0) {
      return RVar1;
    }
    iVar2 = RM_Manager::CloseFile(((this->super_QL_Node).qlm)->rmm,&this->fh);
  }
  if (iVar2 == 0) {
    (this->super_QL_Node).isOpen = false;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

RC QL_NodeRel::CloseIt(){
  RC rc = 0;
  if(useIndex){
    if((rc = qlm.rmm.CloseFile(fh)))
      return (rc);
    if((rc = is.CloseScan()))
      return (rc);
    if((rc = qlm.ixm.CloseIndex(ih )))
      return (rc);
  }
  else{
    if((rc = fs.CloseScan()) || (rc = qlm.rmm.CloseFile(fh)))
      return (rc);
  }
  isOpen = false;
  return (rc);
}